

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&>::operator!=
          (result *__return_storage_ptr__,
          expression_lhs<std::basic_string_view<char,std::char_traits<char>>const&> *this,
          char (*rhs) [6])

{
  lest *this_00;
  size_t __n;
  void *__s1;
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char (*in_R8) [6];
  size_type __rlen;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  __n = *(size_t *)this_00;
  __s1 = *(void **)(this_00 + 8);
  sVar2 = strlen(*rhs);
  bVar3 = true;
  if (__n == sVar2) {
    if (__n != 0) {
      iVar1 = bcmp(__s1,rhs,__n);
      if (iVar1 != 0) goto LAB_001848ad;
    }
    bVar3 = false;
  }
LAB_001848ad:
  local_50._M_len = (size_t)local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"!=","");
  to_string<std::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_70,this_00,&local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar3;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((long *)local_50._M_len != local_40) {
    operator_delete((void *)local_50._M_len,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }